

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_resetWithTestVariable_Test::TestBody(Clone_resetWithTestVariable_Test *this)

{
  element_type *peVar1;
  undefined1 local_78 [8];
  ResetPtr rClone;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  VariablePtr v;
  ResetPtr r;
  Clone_resetWithTestVariable_Test *this_local;
  
  libcellml::Reset::create();
  libcellml::Variable::create();
  peVar1 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"unique",&local_51);
  libcellml::Entity::setId((string *)peVar1);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar1 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Reset::setOrder((int)peVar1);
  peVar1 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Reset::setTestVariable((shared_ptr *)peVar1);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Reset::clone();
  compareReset((shared_ptr *)
               &v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr *)local_78);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_78);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Clone, resetWithTestVariable)
{
    auto r = libcellml::Reset::create();
    auto v = libcellml::Variable::create();

    r->setId("unique");
    r->setOrder(43);
    r->setTestVariable(v);

    auto rClone = r->clone();

    compareReset(r, rClone);
}